

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotation.cpp
# Opt level: O0

void test_qclab_QRotation<double>(void)

{
  QAngle<double> lhs;
  QRotation<double> lhs_00;
  QAngle<double> lhs_01;
  QRotation<double> lhs_02;
  QAngle<double> lhs_03;
  QAngle<double> lhs_04;
  bool bVar1;
  char *pcVar2;
  QAngle<double> *pQVar3;
  char *in_R9;
  __type _Var4;
  double dVar5;
  double __x;
  double __x_00;
  double dVar6;
  double __x_01;
  double dVar7;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double dVar8;
  double __x_15;
  double __x_16;
  double __x_17;
  double __x_18;
  double dVar9;
  double __x_19;
  double __x_20;
  double __x_21;
  double __x_22;
  double __x_23;
  double __x_24;
  double __x_25;
  double __x_26;
  double __x_27;
  double __x_28;
  double __x_29;
  double __x_30;
  AssertHelper local_bb8;
  Message local_bb0;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_53;
  Message local_b90;
  undefined1 local_b88 [8];
  AssertionResult gtest_ar_52;
  Message local_b70;
  undefined1 local_b68 [8];
  AssertionResult gtest_ar_51;
  Message local_b50;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_50;
  Message local_b30;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_49;
  Message local_b10;
  undefined1 local_b08 [8];
  AssertionResult gtest_ar_48;
  QRotation<double> R2_5;
  double theta_4;
  double sin_6;
  double cos_6;
  QRotation<double> R1_4;
  QAngle<double> angle1_4;
  double theta1_4;
  Message local_aa0;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_47;
  Message local_a80;
  undefined1 local_a78 [8];
  AssertionResult gtest_ar_46;
  Message local_a60;
  undefined1 local_a58 [8];
  AssertionResult gtest_ar_45;
  double theta_3;
  double sin_5;
  double cos_5;
  undefined1 local_a20 [8];
  QAngle<double> angle_5;
  undefined1 local_a00 [8];
  QRotation<double> R_8;
  QRotation<double> R2_4;
  QAngle<double> angle2_3;
  double theta2_3;
  QRotation<double> R1_3;
  QAngle<double> angle1_3;
  double theta1_3;
  Message local_998;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_44;
  Message local_978;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_43;
  Message local_958;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_42;
  double theta_2;
  double sin_4;
  double cos_4;
  undefined1 local_918 [8];
  QAngle<double> angle_4;
  undefined1 local_8f8 [8];
  QRotation<double> R_7;
  QRotation<double> R2_3;
  QAngle<double> angle2_2;
  double theta2_2;
  QRotation<double> R1_2;
  QAngle<double> angle1_2;
  double theta1_2;
  Message local_890;
  undefined1 local_888 [8];
  AssertionResult gtest_ar_41;
  Message local_870;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_40;
  Message local_850;
  undefined1 local_848 [8];
  AssertionResult gtest_ar_39;
  Message local_830;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_38;
  Message local_810;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_37;
  Message local_7f0;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_36;
  double theta_1;
  double sin_3;
  double cos_3;
  undefined1 local_7b0 [8];
  QAngle<double> angle_3;
  QRotation<double> R2_2;
  QAngle<double> angle2_1;
  double theta2_1;
  QRotation<double> R1_1;
  QAngle<double> angle1_1;
  double theta1_1;
  Message local_748;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_35;
  Message local_728;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_34;
  Message local_708;
  undefined1 local_700 [8];
  AssertionResult gtest_ar_33;
  Message local_6e8;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_32;
  Message local_6c8;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_31;
  Message local_6a8;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_30;
  double theta;
  double sin_2;
  double cos_2;
  undefined1 local_668 [8];
  QAngle<double> angle_2;
  QRotation<double> R2_1;
  QAngle<double> angle2;
  double theta2;
  QRotation<double> R1;
  QAngle<double> angle1;
  double theta1;
  Message local_600;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_29;
  Message local_5e0;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_28;
  Message local_5c0;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_27;
  QRotation<double> R_6;
  double sin_1;
  double cos_1;
  Message local_580;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_26;
  Message local_560;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_25;
  Message local_540;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_24;
  QRotation<double> R_5;
  double sin;
  double cos;
  Message local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_23;
  Message local_4e0;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_22;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_21;
  QRotation<double> R_4;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_20;
  Message local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_19;
  Message local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_18;
  QRotation<double> R_3;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_17;
  Message local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_16;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_15;
  QRotation<double> R_2;
  QAngle<double> angle_1;
  Message local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_14;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_13;
  Message local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_12;
  QRotation<double> R_1;
  QAngle<double> angle;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  QRotation<double> R2;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_11;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_10;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_9;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_8;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_7;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_6;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_5;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  QAngle<double> new_angle;
  Message local_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  double local_88;
  double local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  double local_48;
  double local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  QRotation<double> R;
  double tol;
  double pi;
  
  _Var4 = std::atan<int>(1);
  dVar5 = _Var4 * 4.0;
  std::numeric_limits<double>::epsilon();
  qclab::QRotation<double>::QRotation((QRotation<double> *)&gtest_ar.message_);
  local_40 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar.message_,__x);
  local_48 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_38,"R.cos()","1.0",&local_40,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_80 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar.message_,__x_00);
  local_88 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_78,"R.sin()","0.0",&local_80,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_b0 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar.message_);
  local_b8 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_a8,"R.theta()","0.0",&local_b0,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&new_angle.sin_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&new_angle.sin_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&new_angle.sin_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&gtest_ar_3.message_,0.5);
  qclab::QRotation<double>::update
            ((QRotation<double> *)&gtest_ar.message_,(angle_type *)&gtest_ar_3.message_);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_e8,"R.theta()","1","tol",dVar6,1.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  dVar6 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar.message_,__x_01);
  dVar7 = ::cos(0.5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_108,"R.cos()","std::cos( 0.5 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar.message_,__x_02);
  dVar7 = ::sin(0.5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_128,"R.sin()","std::sin( 0.5 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  qclab::QRotation<double>::update((QRotation<double> *)&gtest_ar.message_,dVar5 / 2.0);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_148,"R.theta()","pi/2","tol",dVar6,dVar5 / 2.0,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  dVar6 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar.message_,__x_03);
  dVar7 = ::cos(dVar5 / 4.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_168,"R.cos()","std::cos( pi/4 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar.message_,__x_04);
  dVar7 = ::sin(dVar5 / 4.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_188,"R.sin()","std::sin( pi/4 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  dVar6 = ::cos(dVar5 / 3.0);
  dVar7 = ::sin(dVar5 / 3.0);
  qclab::QRotation<double>::update((QRotation<double> *)&gtest_ar.message_,dVar6,dVar7);
  dVar6 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar.message_,__x_05);
  dVar7 = ::cos(dVar5 / 3.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1a8,"R.cos()","std::cos( pi/3 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar.message_,__x_06);
  dVar7 = ::sin(dVar5 / 3.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1c8,"R.sin()","std::sin( pi/3 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1e8,"R.theta()","2*(pi/3)","tol",dVar6,(dVar5 / 3.0) * 2.0,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&R2.angle_.sin_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&R2.angle_.sin_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&R2.angle_.sin_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  dVar6 = ::cos(dVar5 / 3.0);
  dVar7 = ::sin(dVar5 / 3.0);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&gtest_ar_.message_,dVar6,dVar7);
  local_219 = qclab::QRotation<double>::operator==
                        ((QRotation<double> *)&gtest_ar.message_,
                         (QRotation<double> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_218,(AssertionResult *)"R == R2",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  bVar1 = qclab::QRotation<double>::operator!=
                    ((QRotation<double> *)&gtest_ar.message_,
                     (QRotation<double> *)&gtest_ar_.message_);
  local_261 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_260,&local_261,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_260,(AssertionResult *)"R != R2",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  qclab::QRotation<double>::update((QRotation<double> *)&gtest_ar_.message_,1.0);
  local_2a9 = qclab::QRotation<double>::operator!=
                        ((QRotation<double> *)&gtest_ar.message_,
                         (QRotation<double> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_2a8,(AssertionResult *)"R != R2",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  bVar1 = qclab::QRotation<double>::operator==
                    ((QRotation<double> *)&gtest_ar.message_,
                     (QRotation<double> *)&gtest_ar_.message_);
  local_2f1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&angle.sin_,(internal *)local_2f0,(AssertionResult *)"R == R2","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    std::__cxx11::string::~string((string *)&angle.sin_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R_1.angle_.sin_,dVar5 / 2.0);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)&gtest_ar_12.message_,(angle_type *)&R_1.angle_.sin_);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar_12.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_358,"R.theta()","pi","tol",dVar6,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  dVar6 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar_12.message_,__x_07);
  dVar7 = ::cos(dVar5 / 2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_378,"R.cos()","std::cos( pi/2 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar_12.message_,__x_08);
  dVar7 = ::sin(dVar5 / 2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_398,"R.sin()","std::sin( pi/2 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&angle_1.sin_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&angle_1.sin_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&angle_1.sin_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R_2.angle_.sin_,dVar5 / 2.0);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)&gtest_ar_15.message_,(angle_type *)&R_2.angle_.sin_);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar_15.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_3d8,"R.theta()","pi","tol",dVar6,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  dVar6 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar_15.message_,__x_09);
  dVar7 = ::cos(dVar5 / 2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_3f8,"R.cos()","std::cos( pi/2 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar_15.message_,__x_10);
  dVar7 = ::sin(dVar5 / 2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_418,"R.sin()","std::sin( pi/2 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&R_3.angle_.sin_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&R_3.angle_.sin_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&R_3.angle_.sin_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&gtest_ar_18.message_,dVar5 / 2.0);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar_18.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_448,"R.theta()","pi/2","tol",dVar6,dVar5 / 2.0,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  dVar6 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar_18.message_,__x_11);
  dVar7 = ::cos(dVar5 / 4.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_468,"R.cos()","std::cos( pi/4 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar_18.message_,__x_12);
  dVar7 = ::sin(dVar5 / 4.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_488,"R.sin()","std::sin( pi/4 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&R_4.angle_.sin_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&R_4.angle_.sin_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&R_4.angle_.sin_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&gtest_ar_21.message_,dVar5 / 2.0);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar_21.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4b8,"R.theta()","pi/2","tol",dVar6,dVar5 / 2.0,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  dVar6 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar_21.message_,__x_13);
  dVar7 = ::cos(dVar5 / 4.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4d8,"R.cos()","std::cos( pi/4 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar_21.message_,__x_14);
  dVar7 = ::sin(dVar5 / 4.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4f8,"R.sin()","std::sin( pi/4 )","tol",dVar6,dVar7,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  dVar6 = ::cos(dVar5 / 4.0);
  dVar7 = ::sin(dVar5 / 4.0);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&gtest_ar_24.message_,dVar6,dVar7);
  dVar8 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar_24.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_538,"R.theta()","pi/2","tol",dVar8,dVar5 / 2.0,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  dVar8 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar_24.message_,__x_15);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_558,"R.cos()","cos","tol",dVar8,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar_24.message_,__x_16);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_578,"R.sin()","sin","tol",dVar6,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos_1,&local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos_1);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  dVar6 = ::cos(dVar5 / 4.0);
  dVar7 = ::sin(dVar5 / 4.0);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&gtest_ar_27.message_,dVar6,dVar7);
  dVar8 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar_27.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_5b8,"R.theta()","pi/2","tol",dVar8,dVar5 / 2.0,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  dVar8 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar_27.message_,__x_17);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_5d8,"R.cos()","cos","tol",dVar8,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar_27.message_,__x_18);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_5f8,"R.sin()","sin","tol",dVar6,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1,&local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R1.angle_.sin_,dVar5 / 2.0);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&theta2,(angle_type *)&R1.angle_.sin_);
  dVar6 = dVar5 / 3.0;
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R2_1.angle_.sin_,dVar6);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)&angle_2.sin_,(angle_type *)&R2_1.angle_.sin_);
  pQVar3 = (QAngle<double> *)&angle_2.sin_;
  qclab::QRotation<double>::operator*=((QRotation<double> *)&theta2,(QRotation<double> *)pQVar3);
  lhs_04.sin_ = angle1.cos_;
  lhs_04.cos_ = R1.angle_.sin_;
  _local_668 = qclab::operator+((qclab *)&R2_1.angle_.sin_,lhs_04,pQVar3);
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)local_668,local_668);
  dVar8 = qclab::QAngle<double>::sin((QAngle<double> *)local_668,dVar7);
  gtest_ar_30.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_668);
  dVar9 = qclab::QRotation<double>::cos
                    ((QRotation<double> *)&theta2,
                     (double)gtest_ar_30.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_6a0,"R1.cos()","cos","tol",dVar9,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  dVar7 = qclab::QRotation<double>::sin((QRotation<double> *)&theta2,__x_19);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_6c0,"R1.sin()","sin","tol",dVar7,dVar8,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  dVar7 = qclab::QRotation<double>::theta((QRotation<double> *)&theta2);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_6e0,"R1.theta()","2*theta","tol",dVar7,
             (double)gtest_ar_30.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl * 2.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_6e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  dVar7 = qclab::QRotation<double>::cos((QRotation<double> *)&angle_2.sin_,__x_20);
  dVar8 = ::cos(dVar6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_700,"R2.cos()","std::cos( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  dVar7 = qclab::QRotation<double>::sin((QRotation<double> *)&angle_2.sin_,__x_21);
  dVar8 = ::sin(dVar6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_720,"R2.sin()","std::sin( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  dVar7 = qclab::QRotation<double>::theta((QRotation<double> *)&angle_2.sin_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_740,"R2.theta()","2*theta2","tol",dVar7,dVar6 * 2.0,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_1,&local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_1);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R1_1.angle_.sin_,dVar5 / 2.0);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)&theta2_1,(angle_type *)&R1_1.angle_.sin_);
  dVar6 = dVar5 / 3.0;
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R2_2.angle_.sin_,dVar6);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)&angle_3.sin_,(angle_type *)&R2_2.angle_.sin_);
  pQVar3 = (QAngle<double> *)&angle_3.sin_;
  qclab::QRotation<double>::operator/=((QRotation<double> *)&theta2_1,(QRotation<double> *)pQVar3);
  lhs_03.sin_ = angle1_1.cos_;
  lhs_03.cos_ = R1_1.angle_.sin_;
  _local_7b0 = qclab::operator-((qclab *)&R2_2.angle_.sin_,lhs_03,pQVar3);
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)local_7b0,local_7b0);
  dVar8 = qclab::QAngle<double>::sin((QAngle<double> *)local_7b0,dVar7);
  gtest_ar_36.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_7b0);
  dVar9 = qclab::QRotation<double>::cos
                    ((QRotation<double> *)&theta2_1,
                     (double)gtest_ar_36.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_7e8,"R1.cos()","cos","tol",dVar9,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_7f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  dVar7 = qclab::QRotation<double>::sin((QRotation<double> *)&theta2_1,__x_22);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_808,"R1.sin()","sin","tol",dVar7,dVar8,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  dVar7 = qclab::QRotation<double>::theta((QRotation<double> *)&theta2_1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_828,"R1.theta()","2*theta","tol",dVar7,
             (double)gtest_ar_36.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl * 2.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar1) {
    testing::Message::Message(&local_830);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  dVar7 = qclab::QRotation<double>::cos((QRotation<double> *)&angle_3.sin_,__x_23);
  dVar8 = ::cos(dVar6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_848,"R2.cos()","std::cos( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
  dVar7 = qclab::QRotation<double>::sin((QRotation<double> *)&angle_3.sin_,__x_24);
  dVar8 = ::sin(dVar6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_868,"R2.sin()","std::sin( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_870);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_870);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  dVar7 = qclab::QRotation<double>::theta((QRotation<double> *)&angle_3.sin_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_888,"R2.theta()","2*theta2","tol",dVar7,dVar6 * 2.0,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_888);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_2,&local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_2);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R1_2.angle_.sin_,dVar5 / 2.0);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)&theta2_2,(angle_type *)&R1_2.angle_.sin_);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R2_3.angle_.sin_,dVar5 / 3.0);
  pQVar3 = (QAngle<double> *)&R2_3.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)&R_7.angle_.sin_,pQVar3);
  angle_4.sin_ = theta2_2;
  lhs_02.angle_.sin_ = R1_2.angle_.cos_;
  lhs_02.angle_.cos_ = theta2_2;
  _local_8f8 = (angle_type)
               qclab::operator*((qclab *)&R_7.angle_.sin_,lhs_02,(QRotation<double> *)pQVar3);
  lhs_01.sin_ = angle1_2.cos_;
  lhs_01.cos_ = R1_2.angle_.sin_;
  _local_918 = qclab::operator+((qclab *)&R2_3.angle_.sin_,lhs_01,pQVar3);
  dVar6 = qclab::QAngle<double>::cos((QAngle<double> *)local_918,local_918);
  dVar7 = qclab::QAngle<double>::sin((QAngle<double> *)local_918,dVar6);
  gtest_ar_42.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_918);
  dVar8 = qclab::QRotation<double>::cos
                    ((QRotation<double> *)local_8f8,
                     (double)gtest_ar_42.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_950,"R.cos()","cos","tol",dVar8,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)local_8f8,__x_25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_970,"R.sin()","sin","tol",dVar6,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)local_8f8);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_990,"R.theta()","2*theta","tol",dVar6,
             (double)gtest_ar_42.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl * 2.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_998);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_3,&local_998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_3);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R1_3.angle_.sin_,dVar5 / 2.0);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)&theta2_3,(angle_type *)&R1_3.angle_.sin_);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R2_4.angle_.sin_,dVar5 / 3.0);
  pQVar3 = (QAngle<double> *)&R2_4.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)&R_8.angle_.sin_,pQVar3);
  angle_5.sin_ = theta2_3;
  lhs_00.angle_.sin_ = R1_3.angle_.cos_;
  lhs_00.angle_.cos_ = theta2_3;
  _local_a00 = (angle_type)
               qclab::operator/((qclab *)&R_8.angle_.sin_,lhs_00,(QRotation<double> *)pQVar3);
  lhs.sin_ = angle1_3.cos_;
  lhs.cos_ = R1_3.angle_.sin_;
  _local_a20 = qclab::operator-((qclab *)&R2_4.angle_.sin_,lhs,pQVar3);
  dVar6 = qclab::QAngle<double>::cos((QAngle<double> *)local_a20,local_a20);
  dVar7 = qclab::QAngle<double>::sin((QAngle<double> *)local_a20,dVar6);
  gtest_ar_45.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_a20);
  dVar8 = qclab::QRotation<double>::cos
                    ((QRotation<double> *)local_a00,
                     (double)gtest_ar_45.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a58,"R.cos()","cos","tol",dVar8,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
  if (!bVar1) {
    testing::Message::Message(&local_a60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_a60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)local_a00,__x_26);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a78,"R.sin()","sin","tol",dVar6,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a78);
  if (!bVar1) {
    testing::Message::Message(&local_a80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a78);
  dVar6 = qclab::QRotation<double>::theta((QRotation<double> *)local_a00);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a98,"R.theta()","2*theta","tol",dVar6,
             (double)gtest_ar_45.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl * 2.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_aa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_4,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_4);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&R1_4.angle_.sin_,dVar5 / 2.0);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&cos_6,(angle_type *)&R1_4.angle_.sin_);
  dVar5 = qclab::QRotation<double>::cos((QRotation<double> *)&cos_6,__x_27);
  dVar6 = qclab::QRotation<double>::sin((QRotation<double> *)&cos_6,dVar5);
  dVar7 = qclab::QRotation<double>::theta((QRotation<double> *)&cos_6);
  join_0x00001240_0x00001200_ =
       (angle_type)qclab::QRotation<double>::inv((QRotation<double> *)&cos_6);
  dVar8 = qclab::QRotation<double>::cos
                    ((QRotation<double> *)&cos_6,
                     gtest_ar_48.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b08,"R1.cos()","cos","tol",dVar8,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b08);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_b10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b08);
  dVar8 = qclab::QRotation<double>::cos((QRotation<double> *)&gtest_ar_48.message_,__x_28);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b28,"R2.cos()","cos","tol",dVar8,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(&local_b30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,&local_b30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_b30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  dVar5 = qclab::QRotation<double>::sin((QRotation<double> *)&cos_6,__x_29);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b48,"R1.sin()","sin","tol",dVar5,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
  if (!bVar1) {
    testing::Message::Message(&local_b50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_b50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_b50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
  dVar5 = qclab::QRotation<double>::sin((QRotation<double> *)&gtest_ar_48.message_,__x_30);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b68,"R2.sin()","-sin","tol",dVar5,-dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b68);
  if (!bVar1) {
    testing::Message::Message(&local_b70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_b70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_b70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
  dVar5 = qclab::QRotation<double>::theta((QRotation<double> *)&cos_6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b88,"R1.theta()","theta","tol",dVar5,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b88);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b88);
  dVar5 = qclab::QRotation<double>::theta((QRotation<double> *)&gtest_ar_48.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_ba8,"R2.theta()","-theta","tol",dVar5,-dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar1) {
    testing::Message::Message(&local_bb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
    testing::internal::AssertHelper::AssertHelper
              (&local_bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/QRotation.cpp"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bb8,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_bb8);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  return;
}

Assistant:

void test_qclab_QRotation() {

  const T pi = 4 * std::atan(1) ;
  const T tol = 10 * std::numeric_limits< T >::epsilon() ;

  {
    qclab::QRotation< T >  R ;

    EXPECT_EQ( R.cos() , 1.0 ) ;    // cos
    EXPECT_EQ( R.sin() , 0.0 ) ;    // sin
    EXPECT_EQ( R.theta() , 0.0 ) ;  // theta

    // update(angle)
    qclab::QAngle< T >  new_angle( 0.5 ) ;
    R.update( new_angle ) ;
    EXPECT_NEAR( R.theta() , 1 , tol ) ;
    EXPECT_NEAR( R.cos() , std::cos( 0.5 ) , tol ) ;
    EXPECT_NEAR( R.sin() , std::sin( 0.5 ) , tol ) ;

    // update(theta)
    R.update( pi/2 ) ;
    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;
    EXPECT_NEAR( R.cos() , std::cos( pi/4 ) , tol ) ;
    EXPECT_NEAR( R.sin() , std::sin( pi/4 ) , tol ) ;

    // update(cos,sin)
    R.update( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_NEAR( R.cos() , std::cos( pi/3 ) , tol ) ;
    EXPECT_NEAR( R.sin() , std::sin( pi/3 ) , tol ) ;
    EXPECT_NEAR( R.theta() , 2*(pi/3) , tol ) ;

    // operators == and !=
    qclab::QRotation< T >  R2( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_TRUE( R == R2 ) ;
    EXPECT_FALSE( R != R2 ) ;
    R2.update( 1 ) ;
    EXPECT_TRUE( R != R2 ) ;
    EXPECT_FALSE( R == R2 ) ;
}

  {
    qclab::QAngle< T > angle( pi/2 ) ;
    qclab::QRotation< T >  R( angle ) ;

    EXPECT_NEAR( R.theta() , pi , tol ) ;              // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/2 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/2 ) , tol ) ;  // sin
  }

  {
    qclab::QAngle< T > angle( pi/2 ) ;
    qclab::QRotation< T >  R( angle ) ;

    EXPECT_NEAR( R.theta() , pi , tol ) ;              // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/2 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/2 ) , tol ) ;  // sin
  }

  {
    qclab::QRotation< T >  R( pi/2 ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    qclab::QRotation< T >  R( pi/2 ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    const T cos = std::cos( pi/4 ) ;
    const T sin = std::sin( pi/4 ) ;
    qclab::QRotation< T >  R( cos , sin ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;  // theta
    EXPECT_NEAR( R.cos() , cos , tol ) ;     // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;     // sin
  }

  {
    const T cos = std::cos( pi/4 ) ;
    const T sin = std::sin( pi/4 ) ;
    qclab::QRotation< T >  R( cos , sin ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;  // theta
    EXPECT_NEAR( R.cos() , cos , tol ) ;     // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;     // sin
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator *=
    R1 *= R2 ;
    qclab::QAngle< T >  angle = angle1 + angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R1.cos() , cos , tol ) ;                 // cos
    EXPECT_NEAR( R1.sin() , sin , tol ) ;                 // sin
    EXPECT_NEAR( R1.theta() , 2*theta , tol ) ;           // theta
    EXPECT_NEAR( R2.cos() , std::cos( theta2 ) , tol ) ;  // cos
    EXPECT_NEAR( R2.sin() , std::sin( theta2 ) , tol ) ;  // sin
    EXPECT_NEAR( R2.theta() , 2*theta2 , tol ) ;          // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator /=
    R1 /= R2 ;
    qclab::QAngle< T >  angle = angle1 - angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R1.cos() , cos , tol ) ;                 // cos
    EXPECT_NEAR( R1.sin() , sin , tol ) ;                 // sin
    EXPECT_NEAR( R1.theta() , 2*theta , tol ) ;           // theta
    EXPECT_NEAR( R2.cos() , std::cos( theta2 ) , tol ) ;  // cos
    EXPECT_NEAR( R2.sin() , std::sin( theta2 ) , tol ) ;  // sin
    EXPECT_NEAR( R2.theta() , 2*theta2 , tol ) ;          // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator *
    qclab::QRotation< T > R = R1 * R2 ;
    qclab::QAngle< T >  angle = angle1 + angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R.cos() , cos , tol ) ;        // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;        // sin
    EXPECT_NEAR( R.theta() , 2*theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator /
    qclab::QRotation< T > R = R1 / R2 ;
    qclab::QAngle< T >  angle = angle1 - angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R.cos() , cos , tol ) ;        // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;        // sin
    EXPECT_NEAR( R.theta() , 2*theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;
    T cos   = R1.cos() ;
    T sin   = R1.sin() ;
    T theta = R1.theta() ;

    // inv
    qclab::QRotation< T >  R2 = R1.inv() ;
    EXPECT_NEAR( R1.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( R2.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( R1.sin() ,  sin , tol ) ;      // sin
    EXPECT_NEAR( R2.sin() , -sin , tol ) ;      // sin
    EXPECT_NEAR( R1.theta() ,  theta , tol ) ;  // theta
    EXPECT_NEAR( R2.theta() , -theta , tol ) ;  // theta
  }

}